

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexTriangleKernelIter::applyConst
          (PtexTriangleKernelIter *this,float *dst,void *data,DataType dt,int nChan)

{
  float fVar1;
  int iVar2;
  int *in_RDI;
  float fVar3;
  int x;
  float Q;
  float DQ;
  float V;
  float U;
  int x2;
  int x1;
  int xw;
  int vi;
  float DDQ;
  int in_stack_ffffffffffffffa8;
  DataType in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float local_40;
  float in_stack_ffffffffffffffc4;
  int local_28;
  
  fVar1 = (float)in_RDI[9];
  for (local_28 = in_RDI[4]; local_28 != in_RDI[7]; local_28 = local_28 + 1) {
    iVar2 = *in_RDI;
    in_stack_ffffffffffffffb8 = PtexUtils::max<int>(in_RDI[3],(iVar2 - local_28) - in_RDI[8]);
    iVar2 = PtexUtils::min<int>(in_RDI[6],(iVar2 - local_28) - in_RDI[5]);
    fVar3 = (float)in_stack_ffffffffffffffb8 - (float)in_RDI[1];
    in_stack_ffffffffffffffc4 = (float)local_28 - (float)in_RDI[2];
    local_40 = (float)in_RDI[9] * (fVar3 + fVar3 + 1.0) +
               (float)in_RDI[10] * in_stack_ffffffffffffffc4;
    in_stack_ffffffffffffffbc =
         (float)in_RDI[9] * fVar3 * fVar3 +
         ((float)in_RDI[10] * fVar3 + (float)in_RDI[0xb] * in_stack_ffffffffffffffc4) *
         in_stack_ffffffffffffffc4;
    for (; in_stack_ffffffffffffffb8 < iVar2;
        in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
      if (in_stack_ffffffffffffffbc < 1.0) {
        fVar3 = anon_unknown_2::gaussian(0.0);
        in_RDI[0xe] = (int)(fVar3 * (float)in_RDI[0xd] + (float)in_RDI[0xe]);
      }
      in_stack_ffffffffffffffbc = local_40 + in_stack_ffffffffffffffbc;
      local_40 = fVar1 * 2.0 + local_40;
    }
  }
  PtexUtils::applyConst
            (in_stack_ffffffffffffffc4,
             (float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI,
             in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void PtexTriangleKernelIter::applyConst(float* dst, void* data, DataType dt, int nChan)
{
    // iterate over texel locations and calculate weight as if texture weren't const
    float DDQ = 2.0f*A;
    for (int vi = v1; vi != v2; vi++) {
        int xw = rowlen - vi;
        int x1 = PtexUtils::max(u1, xw-w2);
        int x2 = PtexUtils::min(u2, xw-w1);
        float U = (float)x1 - u;
        float V = (float)vi - v;
        float DQ = A*(2.0f*U+1.0f)+B*V;
        float Q = A*U*U + (B*U + C*V)*V;
        for (int x = x1; x < x2; x++) {
            if (Q < 1.0f) {
                weight += gaussian(Q)*wscale;
            }
            Q += DQ;
            DQ += DDQ;
        }
    }

    // apply weight to single texel value
    PtexUtils::applyConst(weight, dst, data, dt, nChan);
}